

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O1

bool __thiscall
Parser::try_parse_message<ParsedGame::RulesTokenType>
          (Parser *this,
          vector<Token<ParsedGame::RulesTokenType>,_std::allocator<Token<ParsedGame::RulesTokenType>_>_>
          *tokens_array)

{
  pointer pcVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __tmp;
  char *pcVar7;
  ci_equal equal_comp;
  string temp_buffer;
  ci_equal local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  undefined1 local_90 [24];
  int local_78;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  std::__cxx11::string::push_back((char)&local_c0);
  bVar6 = 1;
  while (bVar3 = (**(code **)((long)((this->m_text_provider)._M_t.
                                     super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                     .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                                    _vptr_TextProvider + 0x10))(), (bVar3 & bVar6) == 1) {
    (**(code **)((long)((this->m_text_provider)._M_t.
                        super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t
                        .super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
                        super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                       _vptr_TextProvider + 0x18))();
    bVar4 = try_parse_return(this,false);
    if ((bVar4) ||
       (((this->m_text_provider)._M_t.
         super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
         super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
         super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->m_current_char == ' ')) {
      bVar6 = 0;
    }
    else {
      std::__cxx11::string::push_back((char)&local_c0);
    }
  }
  local_a0 = (undefined1  [8])local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Message","");
  bVar4 = ci_equal::operator()(&local_c1,(string *)local_a0,&local_c0);
  if (local_a0 != (undefined1  [8])local_90) {
    operator_delete((void *)local_a0,local_90._0_8_ + 1);
  }
  if (bVar4) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    iVar2 = this->m_line_counter;
    local_a0._0_4_ = 0x1d;
    pcVar1 = local_90 + 8;
    local_98._M_p = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_50,local_48 + (long)local_50);
    local_78 = iVar2;
    std::vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
    ::emplace_back<Token<ParsedGame::RulesTokenType>>
              ((vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
                *)tokens_array,(Token<ParsedGame::RulesTokenType> *)local_a0);
    if (local_98._M_p != pcVar1) {
      operator_delete(local_98._M_p,local_90._8_8_ + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_c0._M_string_length = 0;
    *local_c0._M_dataplus._M_p = '\0';
    bVar6 = 1;
    while (bVar3 = (**(code **)((long)((this->m_text_provider)._M_t.
                                       super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                       .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                                      _vptr_TextProvider + 0x10))(), (bVar3 & bVar6) == 1) {
      (**(code **)((long)((this->m_text_provider)._M_t.
                          super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                          .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                         _vptr_TextProvider + 0x18))();
      bVar5 = try_parse_return(this,false);
      if (bVar5) {
        bVar6 = 0;
        (**(code **)((long)((this->m_text_provider)._M_t.
                            super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                            .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                           _vptr_TextProvider + 0x20))();
      }
      else {
        std::__cxx11::string::push_back((char)&local_c0);
      }
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_c0._M_dataplus._M_p,
               local_c0._M_dataplus._M_p + local_c0._M_string_length);
    iVar2 = this->m_line_counter;
    local_a0._0_4_ = 0x1e;
    local_98._M_p = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70,local_68 + (long)local_70);
    local_78 = iVar2;
    std::vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
    ::emplace_back<Token<ParsedGame::RulesTokenType>>
              ((vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
                *)tokens_array,(Token<ParsedGame::RulesTokenType> *)local_a0);
    if (local_98._M_p != pcVar1) {
      operator_delete(local_98._M_p,local_90._8_8_ + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  else if (local_c0._M_string_length != 0) {
    pcVar7 = local_c0._M_dataplus._M_p + local_c0._M_string_length;
    do {
      (**(code **)((long)((this->m_text_provider)._M_t.
                          super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                          .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                         _vptr_TextProvider + 0x20))();
      pcVar7 = pcVar7 + -1;
    } while (pcVar7 != local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool try_parse_message(vector<Token<TokenType>>& tokens_array)
	{
		string temp_buffer = "";
		temp_buffer.push_back(m_text_provider->get_current_char());

		bool detected_word_end = false;
		while(m_text_provider->is_valid() && !detected_word_end)
		{
			m_text_provider->advance();
			if(try_parse_return(false))
			{
				detected_word_end = true;
			}
			else
			{
				switch(m_text_provider->get_current_char())
				{
					case ' ':
						detected_word_end = true;
					break;
					default:
						temp_buffer.push_back(m_text_provider->get_current_char());
					break;
				}
			}
		}

		ci_equal equal_comp;
		if(equal_comp("Message",temp_buffer))
		{
			//add token message and parse the rest
			tokens_array.push_back(Token<TokenType>(TokenType::MESSAGE,"",m_line_counter));

			temp_buffer.clear();

			detected_word_end = false;
			while(m_text_provider->is_valid() && !detected_word_end)
			{
				m_text_provider->advance();
				if(try_parse_return(false))
				{
					detected_word_end = true;
					m_text_provider->reverse();
				}
				else
				{
					temp_buffer.push_back(m_text_provider->get_current_char());
				}
			}
			tokens_array.push_back(Token<TokenType>(TokenType::MessageContent,temp_buffer,m_line_counter));

			return true;
		}
		else
		{
			//reverse everything and return false, we couldn't properly parse a message token
			for(auto it = temp_buffer.rbegin(); it != temp_buffer.rend(); it++)
			{
				m_text_provider->reverse();
			}
			return false;
		}
	}